

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O0

int libpd_message(char *recv,char *msg,int argc,t_atom *argv)

{
  t_pd *x;
  t_symbol *s;
  t_pd *obj;
  t_atom *argv_local;
  int argc_local;
  char *msg_local;
  char *recv_local;
  
  sys_lock();
  x = (t_pd *)get_object(recv);
  if (x == (t_pd *)0x0) {
    sys_unlock();
    recv_local._4_4_ = -1;
  }
  else {
    s = gensym(msg);
    pd_typedmess(x,s,argc,argv);
    sys_unlock();
    recv_local._4_4_ = 0;
  }
  return recv_local._4_4_;
}

Assistant:

int libpd_message(const char *recv, const char *msg, int argc, t_atom *argv) {
  t_pd *obj;
  sys_lock();
  obj = get_object(recv);
  if (obj == NULL)
  {
    sys_unlock();
    return -1;
  }
  pd_typedmess(obj, gensym(msg), argc, argv);
  sys_unlock();
  return 0;
}